

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

void av1_cdef_dealloc_data(CdefSearchCtx *cdef_search_ctx)

{
  if (cdef_search_ctx != (CdefSearchCtx *)0x0) {
    aom_free(cdef_search_ctx->mse[0]);
    cdef_search_ctx->mse[0] = (uint64_t (*) [64])0x0;
    aom_free(cdef_search_ctx->mse[1]);
    cdef_search_ctx->mse[1] = (uint64_t (*) [64])0x0;
    aom_free(cdef_search_ctx->sb_index);
    cdef_search_ctx->sb_index = (int *)0x0;
  }
  return;
}

Assistant:

void av1_cdef_dealloc_data(CdefSearchCtx *cdef_search_ctx) {
  if (cdef_search_ctx) {
    aom_free(cdef_search_ctx->mse[0]);
    cdef_search_ctx->mse[0] = NULL;
    aom_free(cdef_search_ctx->mse[1]);
    cdef_search_ctx->mse[1] = NULL;
    aom_free(cdef_search_ctx->sb_index);
    cdef_search_ctx->sb_index = NULL;
  }
}